

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_wait.c
# Opt level: O0

void nsync::nsync_mu_wait
               (nsync_mu *mu,_func_int_void_ptr *condition,void *condition_arg,
               _func_int_void_ptr_void_ptr *condition_arg_eq)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong in_stack_ffffffffffffffc0;
  _func_int_void_ptr_void_ptr *condition_arg_eq_local;
  void *condition_arg_local;
  _func_int_void_ptr *condition_local;
  nsync_mu *mu_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_stack_ffffffffffffffc0;
  iVar2 = nsync_mu_wait_with_deadline
                    ((nsync *)mu,(nsync_mu *)condition,(_func_int_void_ptr *)condition_arg,
                     condition_arg_eq,(_func_int_void_ptr_void_ptr *)0x7fffffffffffffff,
                     (nsync_time)(auVar1 << 0x40),(nsync_note)0x3b9ac9ff);
  if (iVar2 != 0) {
    nsync_panic_("nsync_mu_wait woke but condition not true\n");
  }
  return;
}

Assistant:

void nsync_mu_wait (nsync_mu *mu, int (*condition) (const void *condition_arg),
                    const void *condition_arg,
		    int (*condition_arg_eq) (const void *a, const void *b)) {
	if (nsync_mu_wait_with_deadline (mu, condition, condition_arg, condition_arg_eq,
					 nsync_time_no_deadline, NULL) != 0) {
		nsync_panic_ ("nsync_mu_wait woke but condition not true\n");
	}
}